

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O2

char * SHA512_End(SHA512_CTX *context,char *buffer)

{
  byte bVar1;
  long lVar2;
  byte local_48 [64];
  
  if (context != (SHA512_CTX *)0x0) {
    if (buffer == (char *)0x0) {
      buffer = (char *)0x0;
      context->buffer[0x40] = '\0';
      context->buffer[0x41] = '\0';
      context->buffer[0x42] = '\0';
      context->buffer[0x43] = '\0';
      context->buffer[0x44] = '\0';
      context->buffer[0x45] = '\0';
      context->buffer[0x46] = '\0';
      context->buffer[0x47] = '\0';
      context->buffer[0x48] = '\0';
      context->buffer[0x49] = '\0';
      context->buffer[0x4a] = '\0';
      context->buffer[0x4b] = '\0';
      context->buffer[0x4c] = '\0';
      context->buffer[0x4d] = '\0';
      context->buffer[0x4e] = '\0';
      context->buffer[0x4f] = '\0';
      context->buffer[0x50] = '\0';
      context->buffer[0x51] = '\0';
      context->buffer[0x52] = '\0';
      context->buffer[0x53] = '\0';
      context->buffer[0x54] = '\0';
      context->buffer[0x55] = '\0';
      context->buffer[0x56] = '\0';
      context->buffer[0x57] = '\0';
      context->buffer[0x58] = '\0';
      context->buffer[0x59] = '\0';
      context->buffer[0x5a] = '\0';
      context->buffer[0x5b] = '\0';
      context->buffer[0x5c] = '\0';
      context->buffer[0x5d] = '\0';
      context->buffer[0x5e] = '\0';
      context->buffer[0x5f] = '\0';
      context->buffer[0x60] = '\0';
      context->buffer[0x61] = '\0';
      context->buffer[0x62] = '\0';
      context->buffer[99] = '\0';
      context->buffer[100] = '\0';
      context->buffer[0x65] = '\0';
      context->buffer[0x66] = '\0';
      context->buffer[0x67] = '\0';
      context->buffer[0x68] = '\0';
      context->buffer[0x69] = '\0';
      context->buffer[0x6a] = '\0';
      context->buffer[0x6b] = '\0';
      context->buffer[0x6c] = '\0';
      context->buffer[0x6d] = '\0';
      context->buffer[0x6e] = '\0';
      context->buffer[0x6f] = '\0';
      context->buffer[0x70] = '\0';
      context->buffer[0x71] = '\0';
      context->buffer[0x72] = '\0';
      context->buffer[0x73] = '\0';
      context->buffer[0x74] = '\0';
      context->buffer[0x75] = '\0';
      context->buffer[0x76] = '\0';
      context->buffer[0x77] = '\0';
      context->buffer[0x78] = '\0';
      context->buffer[0x79] = '\0';
      context->buffer[0x7a] = '\0';
      context->buffer[0x7b] = '\0';
      context->buffer[0x7c] = '\0';
      context->buffer[0x7d] = '\0';
      context->buffer[0x7e] = '\0';
      context->buffer[0x7f] = '\0';
      context->buffer[0x30] = '\0';
      context->buffer[0x31] = '\0';
      context->buffer[0x32] = '\0';
      context->buffer[0x33] = '\0';
      context->buffer[0x34] = '\0';
      context->buffer[0x35] = '\0';
      context->buffer[0x36] = '\0';
      context->buffer[0x37] = '\0';
      context->buffer[0x38] = '\0';
      context->buffer[0x39] = '\0';
      context->buffer[0x3a] = '\0';
      context->buffer[0x3b] = '\0';
      context->buffer[0x3c] = '\0';
      context->buffer[0x3d] = '\0';
      context->buffer[0x3e] = '\0';
      context->buffer[0x3f] = '\0';
      context->buffer[0x40] = '\0';
      context->buffer[0x41] = '\0';
      context->buffer[0x42] = '\0';
      context->buffer[0x43] = '\0';
      context->buffer[0x44] = '\0';
      context->buffer[0x45] = '\0';
      context->buffer[0x46] = '\0';
      context->buffer[0x47] = '\0';
      context->buffer[0x48] = '\0';
      context->buffer[0x49] = '\0';
      context->buffer[0x4a] = '\0';
      context->buffer[0x4b] = '\0';
      context->buffer[0x4c] = '\0';
      context->buffer[0x4d] = '\0';
      context->buffer[0x4e] = '\0';
      context->buffer[0x4f] = '\0';
      context->buffer[0x50] = '\0';
      context->buffer[0x51] = '\0';
      context->buffer[0x52] = '\0';
      context->buffer[0x53] = '\0';
      context->buffer[0x54] = '\0';
      context->buffer[0x55] = '\0';
      context->buffer[0x56] = '\0';
      context->buffer[0x57] = '\0';
      context->buffer[0x58] = '\0';
      context->buffer[0x59] = '\0';
      context->buffer[0x5a] = '\0';
      context->buffer[0x5b] = '\0';
      context->buffer[0x5c] = '\0';
      context->buffer[0x5d] = '\0';
      context->buffer[0x5e] = '\0';
      context->buffer[0x5f] = '\0';
      context->buffer[0x60] = '\0';
      context->buffer[0x61] = '\0';
      context->buffer[0x62] = '\0';
      context->buffer[99] = '\0';
      context->buffer[100] = '\0';
      context->buffer[0x65] = '\0';
      context->buffer[0x66] = '\0';
      context->buffer[0x67] = '\0';
      context->buffer[0x68] = '\0';
      context->buffer[0x69] = '\0';
      context->buffer[0x6a] = '\0';
      context->buffer[0x6b] = '\0';
      context->buffer[0x6c] = '\0';
      context->buffer[0x6d] = '\0';
      context->buffer[0x6e] = '\0';
      context->buffer[0x6f] = '\0';
      context->bitcount[0] = 0;
      context->bitcount[1] = 0;
      context->buffer[0] = '\0';
      context->buffer[1] = '\0';
      context->buffer[2] = '\0';
      context->buffer[3] = '\0';
      context->buffer[4] = '\0';
      context->buffer[5] = '\0';
      context->buffer[6] = '\0';
      context->buffer[7] = '\0';
      context->buffer[8] = '\0';
      context->buffer[9] = '\0';
      context->buffer[10] = '\0';
      context->buffer[0xb] = '\0';
      context->buffer[0xc] = '\0';
      context->buffer[0xd] = '\0';
      context->buffer[0xe] = '\0';
      context->buffer[0xf] = '\0';
      context->buffer[0x10] = '\0';
      context->buffer[0x11] = '\0';
      context->buffer[0x12] = '\0';
      context->buffer[0x13] = '\0';
      context->buffer[0x14] = '\0';
      context->buffer[0x15] = '\0';
      context->buffer[0x16] = '\0';
      context->buffer[0x17] = '\0';
      context->buffer[0x18] = '\0';
      context->buffer[0x19] = '\0';
      context->buffer[0x1a] = '\0';
      context->buffer[0x1b] = '\0';
      context->buffer[0x1c] = '\0';
      context->buffer[0x1d] = '\0';
      context->buffer[0x1e] = '\0';
      context->buffer[0x1f] = '\0';
      context->buffer[0x20] = '\0';
      context->buffer[0x21] = '\0';
      context->buffer[0x22] = '\0';
      context->buffer[0x23] = '\0';
      context->buffer[0x24] = '\0';
      context->buffer[0x25] = '\0';
      context->buffer[0x26] = '\0';
      context->buffer[0x27] = '\0';
      context->buffer[0x28] = '\0';
      context->buffer[0x29] = '\0';
      context->buffer[0x2a] = '\0';
      context->buffer[0x2b] = '\0';
      context->buffer[0x2c] = '\0';
      context->buffer[0x2d] = '\0';
      context->buffer[0x2e] = '\0';
      context->buffer[0x2f] = '\0';
      context->state[0] = 0;
      context->state[1] = 0;
      context->state[2] = 0;
      context->state[3] = 0;
      context->state[4] = 0;
      context->state[5] = 0;
      context->state[6] = 0;
      context->state[7] = 0;
    }
    else {
      SHA512_Final(local_48,(SHA512_CTX *)context);
      for (lVar2 = 0; (int)lVar2 != 0x40; lVar2 = lVar2 + 1) {
        bVar1 = local_48[lVar2];
        *buffer = "0123456789abcdef"[bVar1 >> 4];
        buffer[1] = "0123456789abcdef"[bVar1 & 0xf];
        buffer = buffer + 2;
      }
      *buffer = '\0';
    }
    return buffer;
  }
  __assert_fail("context != (SHA512_CTX*)0",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sha2.c",
                0x3b9,"char *SHA512_End(SHA512_CTX *, char *)");
}

Assistant:

char *SHA512_End(SHA512_CTX* context, char buffer[SHA512_DIGEST_STRING_LENGTH]) {
	sha2_byte	digest[SHA512_DIGEST_LENGTH], *d = digest;
	int		i;

	/* Sanity check: */
	assert(context != (SHA512_CTX*)0);

	if (buffer != (char*)0) {
		SHA512_Final(digest, context);

		for (i = 0; i < SHA512_DIGEST_LENGTH; i++) {
			*buffer++ = sha2_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha2_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		MEMSET_BZERO(context, sizeof(SHA512_CTX));
	}
	MEMSET_BZERO(digest, SHA512_DIGEST_LENGTH);
	return buffer;
}